

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void mp::
     WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
               (Writer *w,LinearExpr *linear,
               BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> nonlinear,VarNamer vnam)

{
  bool bVar1;
  pointer pTVar2;
  SafeBool SVar3;
  undefined8 in_RCX;
  Writer *in_RDI;
  double dVar4;
  double coef;
  const_iterator e;
  const_iterator i;
  bool have_terms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  Writer *in_stack_ffffffffffffff00;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  *in_stack_ffffffffffffff08;
  ExprBase in_stack_ffffffffffffff10;
  BasicWriter<char> *in_stack_ffffffffffffff18;
  Writer *in_stack_ffffffffffffff20;
  BasicStringRef<char> in_stack_ffffffffffffff28;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  *in_stack_ffffffffffffff48;
  ExprBase in_stack_ffffffffffffff50;
  small_vector_iterator<const_mp::LinearExpr::Term_*,_long> local_30;
  byte local_21;
  Writer *local_18;
  undefined8 local_10;
  ExprBase local_8;
  
  local_21 = 0;
  local_18 = in_RDI;
  local_10 = in_RCX;
  local_30.m_ptr = (Term *)LinearExpr::begin((LinearExpr *)in_stack_fffffffffffffef8);
  LinearExpr::end((LinearExpr *)in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = gch::operator!=((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
                            in_stack_ffffffffffffff00,
                            (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
                            in_stack_fffffffffffffef8);
    if (!bVar1) break;
    pTVar2 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x1a37e4);
    dVar4 = LinearExpr::Term::coef(pTVar2);
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      if ((local_21 & 1) == 0) {
        local_21 = 1;
      }
      else {
        in_stack_ffffffffffffff20 = local_18;
        fmt::BasicStringRef<char>::BasicStringRef
                  ((BasicStringRef<char> *)in_stack_ffffffffffffff00,
                   (char *)in_stack_fffffffffffffef8);
        fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      }
      if ((dVar4 != 1.0) || (NAN(dVar4))) {
        in_stack_ffffffffffffff18 =
             fmt::BasicWriter<char>::operator<<
                       (in_stack_ffffffffffffff20,(double)in_stack_ffffffffffffff18);
        fmt::BasicStringRef<char>::BasicStringRef
                  ((BasicStringRef<char> *)in_stack_ffffffffffffff00,
                   (char *)in_stack_fffffffffffffef8);
        fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      }
      in_stack_ffffffffffffff10.impl_ = (Impl *)local_18;
      pTVar2 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                         ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x1a38db);
      LinearExpr::Term::var_index(pTVar2);
      BasicProblem<mp::BasicProblemParams<int>>::VarNamer::vname_abi_cxx11_
                ((VarNamer *)in_stack_ffffffffffffff00,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    }
    gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator++(&local_30);
  }
  SVar3 = internal::ExprBase::operator_cast_to_function_pointer(&local_8);
  if ((SVar3 == 0) ||
     (bVar1 = IsZero<mp::internal::ExprTypes,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                        ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                         in_stack_ffffffffffffff10.impl_), bVar1)) {
    if ((local_21 & 1) == 0) {
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8
                );
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    }
  }
  else {
    if ((local_21 & 1) != 0) {
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)local_18,(char *)in_stack_fffffffffffffef8);
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff00 = local_18;
    }
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    ExprWriter(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (VarNamer)in_stack_ffffffffffffff10.impl_);
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    Visit(in_stack_ffffffffffffff48,(NumericExpr)in_stack_ffffffffffffff50.impl_,local_10._4_4_);
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    ~ExprWriter((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                 *)0x1a3a40);
  }
  return;
}

Assistant:

void WriteExpr(fmt::Writer &w, const LinearExpr &linear,
               NumericExpr nonlinear, Namer vnam={}) {
  bool have_terms = false;
  for (auto i = linear.begin(), e = linear.end(); i != e; ++i) {
    double coef = i->coef();
    if (coef != 0) {
      if (have_terms)
        w << " + ";
      else
        have_terms = true;
      if (coef != 1)
        w << coef << " * ";
      w << vnam.vname(i->var_index());
    }
  }
  if (!nonlinear || IsZero<ExprTypes>(nonlinear)) {
    if (!have_terms)
      w << "0";
    return;
  }
  if (have_terms)
    w << " + ";
  ExprWriter<ExprTypes, Namer>(w, vnam).Visit(nonlinear);
}